

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

void __thiscall rengine::RectangleNodeBase::setGeometry(RectangleNodeBase *this,rect2d rect)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  bool updateH;
  bool updateW;
  bool updateY;
  bool updateX;
  RectangleNodeBase *this_local;
  rect2d rect_local;
  
  rect_local.tl = rect.br;
  this_local = (RectangleNodeBase *)rect.tl;
  fVar1 = rect2d::x((rect2d *)&this_local);
  fVar2 = rect2d::x((rect2d *)&(this->super_Node).field_0x34);
  fVar3 = rect2d::y((rect2d *)&this_local);
  fVar4 = rect2d::y((rect2d *)&(this->super_Node).field_0x34);
  fVar5 = rect2d::width((rect2d *)&this_local);
  fVar6 = rect2d::width((rect2d *)&(this->super_Node).field_0x34);
  fVar7 = rect2d::height((rect2d *)&this_local);
  fVar8 = rect2d::height((rect2d *)&(this->super_Node).field_0x34);
  if ((((fVar1 != fVar2) || (fVar3 != fVar4)) || (fVar5 != fVar6)) || (fVar7 != fVar8)) {
    *(RectangleNodeBase **)&(this->super_Node).field_0x34 = this_local;
    *(float *)&this->field_0x3c = rect_local.tl.x;
    *(float *)&this->field_0x40 = rect_local.tl.y;
    if (fVar1 != fVar2) {
      Signal<>::emit(&onXChanged,(SignalEmitter *)this);
    }
    if (fVar3 != fVar4) {
      Signal<>::emit(&onYChanged,(SignalEmitter *)this);
    }
    if (fVar5 != fVar6) {
      Signal<>::emit(&onWidthChanged,(SignalEmitter *)this);
    }
    if (fVar7 != fVar8) {
      Signal<>::emit(&onHeightChanged,(SignalEmitter *)this);
    }
  }
  return;
}

Assistant:

void setGeometry(rect2d rect) {
        bool updateX = rect.x() != m_geometry.x();
        bool updateY = rect.y() != m_geometry.y();
        bool updateW = rect.width() != m_geometry.width();
        bool updateH = rect.height() != m_geometry.height();
        if (!updateX && !updateY && !updateW && !updateH)
            return;
        m_geometry = rect;
        if (updateX) onXChanged.emit(this);
        if (updateY) onYChanged.emit(this);
        if (updateW) onWidthChanged.emit(this);
        if (updateH) onHeightChanged.emit(this);
    }